

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O2

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_false>::set_options
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_false> *this,
          unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_> *str)

{
  Struct *pSVar1;
  long lVar2;
  
  pSVar1 = (str->_M_t).
           super___uniq_ptr_impl<Reflection::Struct,_std::default_delete<Reflection::Struct>_>._M_t.
           super__Tuple_impl<0UL,_Reflection::Struct_*,_std::default_delete<Reflection::Struct>_>.
           super__Head_base<0UL,_Reflection::Struct_*,_false>._M_head_impl;
  if (pSVar1 == (Struct *)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = __dynamic_cast(pSVar1,&Reflection::Struct::typeinfo,&II::Machine::Options::typeinfo,0);
  }
  MachineTypes::ScanProducer::set_video_signal_configurable
            (&this->super_ScanProducer,*(Display *)(lVar2 + 8));
  II::Video::VideoBase::set_use_square_pixels
            (&(this->video_).super_VideoBase,*(bool *)(lVar2 + 0xc));
  return;
}

Assistant:

void set_options(const std::unique_ptr<Reflection::Struct> &str) {
			const auto options = dynamic_cast<Options *>(str.get());
			set_video_signal_configurable(options->output);
			video_.set_use_square_pixels(options->use_square_pixels);
		}